

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O3

void LEARNER::multiline_learn_or_predict<false>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  int iVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  ulong uVar4;
  multi_ex *__range2;
  multi_learner *pmVar5;
  multi_learner *pmVar6;
  uint64_t *puVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  void *local_58;
  iterator iStack_50;
  unsigned_long *local_48;
  multi_learner *local_38;
  
  local_58 = (void *)0x0;
  iStack_50._M_current = (unsigned_long *)0x0;
  local_48 = (unsigned_long *)0x0;
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pmVar6 = base;
  if (ppeVar3 == ppeVar2) {
    pmVar6 = base + 0xe0;
    pmVar5 = base;
  }
  else {
    do {
      local_38 = pmVar6;
      puVar7 = &((*ppeVar3)->super_example_predict).ft_offset;
      if (iStack_50._M_current == local_48) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,iStack_50,puVar7
                  );
      }
      else {
        *iStack_50._M_current = *puVar7;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      *puVar7 = offset;
      ppeVar3 = ppeVar3 + 1;
      pmVar6 = local_38;
    } while (ppeVar3 != ppeVar2);
    ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pmVar6 = local_38 + 0xe0;
    pmVar5 = local_38;
    if (ppeVar3 != ppeVar2) {
      iVar1 = *(int *)pmVar6;
      do {
        puVar7 = &((*ppeVar3)->super_example_predict).ft_offset;
        *puVar7 = *puVar7 + (ulong)(iVar1 * id);
        ppeVar3 = ppeVar3 + 1;
      } while (ppeVar3 != ppeVar2);
    }
  }
  (**(code **)(pmVar5 + 0x30))
            (*(undefined8 *)(pmVar5 + 0x18),*(undefined8 *)(pmVar5 + 0x20),examples);
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar3 != ppeVar2) {
    iVar1 = *(int *)pmVar6;
    do {
      puVar7 = &((*ppeVar3)->super_example_predict).ft_offset;
      *puVar7 = *puVar7 - (ulong)(id * iVar1);
      ppeVar3 = ppeVar3 + 1;
    } while (ppeVar3 != ppeVar2);
    ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppeVar3) {
      uVar4 = 0;
      do {
        (ppeVar3[uVar4]->super_example_predict).ft_offset =
             *(uint64_t *)((long)local_58 + uVar4 * 8);
        uVar4 = uVar4 + 1;
        ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(examples->
                                     super__Vector_base<example_*,_std::allocator<example_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3)
              );
      goto LAB_001cc4c3;
    }
  }
  if (local_58 == (void *)0x0) {
    return;
  }
LAB_001cc4c3:
  operator_delete(local_58);
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets;
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}